

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O3

curl_socket_t Curl_getconnectinfo(Curl_easy *data,connectdata **connp)

{
  connectdata *pcVar1;
  curl_socket_t cVar2;
  Curl_multi *pCVar3;
  connectdata *local_30;
  char local_28;
  
  pcVar1 = (data->state).lastconnect;
  cVar2 = -1;
  if ((pcVar1 != (connectdata *)0x0) &&
     ((pCVar3 = data->multi_easy, pCVar3 != (Curl_multi *)0x0 ||
      (pCVar3 = data->multi, pCVar3 != (Curl_multi *)0x0)))) {
    local_28 = '\0';
    local_30 = pcVar1;
    Curl_conncache_foreach(data,&pCVar3->conn_cache,&local_30,conn_is_conn);
    if (local_28 == '\0') {
      (data->state).lastconnect = (connectdata *)0x0;
      cVar2 = -1;
    }
    else {
      if (connp != (connectdata **)0x0) {
        *connp = pcVar1;
      }
      cVar2 = pcVar1->sock[0];
    }
  }
  return cVar2;
}

Assistant:

curl_socket_t Curl_getconnectinfo(struct Curl_easy *data,
                                  struct connectdata **connp)
{
  curl_socket_t sockfd;

  DEBUGASSERT(data);

  /* this works for an easy handle:
   * - that has been used for curl_easy_perform()
   * - that is associated with a multi handle, and whose connection
   *   was detached with CURLOPT_CONNECT_ONLY
   */
  if(data->state.lastconnect && (data->multi_easy || data->multi)) {
    struct connectdata *c = data->state.lastconnect;
    struct connfind find;
    find.tofind = data->state.lastconnect;
    find.found = FALSE;

    Curl_conncache_foreach(data, data->multi_easy?
                           &data->multi_easy->conn_cache:
                           &data->multi->conn_cache, &find, conn_is_conn);

    if(!find.found) {
      data->state.lastconnect = NULL;
      return CURL_SOCKET_BAD;
    }

    if(connp)
      /* only store this if the caller cares for it */
      *connp = c;
    sockfd = c->sock[FIRSTSOCKET];
  }
  else
    return CURL_SOCKET_BAD;

  return sockfd;
}